

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

bool __thiscall
wasm::
SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
::
IteratorBase<wasm::SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::__detail::_Node_const_iterator<wasm::HeapType,_true,_true>_>
::operator==(IteratorBase<wasm::SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::__detail::_Node_const_iterator<wasm::HeapType,_true,_true>_>
             *this,Iterator *other)

{
  Fatal local_1a8;
  Iterator *local_20;
  Iterator *other_local;
  IteratorBase<wasm::SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::__detail::_Node_const_iterator<wasm::HeapType,_true,_true>_>
  *this_local;
  
  if (this->parent == other->parent) {
    local_20 = other;
    other_local = this;
    if ((this->usingFixed & 1U) != (other->usingFixed & 1U)) {
      Fatal::Fatal(&local_1a8);
      Fatal::operator<<(&local_1a8,
                        (char (*) [50])"SmallSet does not support changes while iterating");
      Fatal::~Fatal(&local_1a8);
    }
    if ((this->usingFixed & 1U) == 0) {
      this_local._7_1_ =
           std::__detail::operator==
                     (&(this->flexibleIterator).super__Node_iterator_base<wasm::HeapType,_true>,
                      &(other->flexibleIterator).super__Node_iterator_base<wasm::HeapType,_true>);
    }
    else {
      this_local._7_1_ = this->fixedIndex == other->fixedIndex;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Iterator& other) const {
      if (parent != other.parent) {
        return false;
      }
      // std::set allows changes while iterating. For us here, though, it would
      // be nontrivial to support that given we have two iterators that we
      // generalize over (switching "in the middle" would not be easy or fast),
      // so error on that.
      if (usingFixed != other.usingFixed) {
        Fatal() << "SmallSet does not support changes while iterating";
      }
      if (usingFixed) {
        return fixedIndex == other.fixedIndex;
      } else {
        return flexibleIterator == other.flexibleIterator;
      }
    }